

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodegenerator.cpp
# Opt level: O2

void stackjit::ByteCodeGenerator::generateClass(ostream *stream,Class *classDef)

{
  pointer pFVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  AttributeContainer *pAVar5;
  vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_> *pvVar6;
  Field *field;
  pointer this;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  poVar3 = std::operator<<(stream,"class ");
  psVar4 = Loader::Class::name_abi_cxx11_(classDef);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  Loader::Class::parentClassName_abi_cxx11_(&local_50,classDef);
  bVar2 = std::operator!=(&local_50,"");
  if (bVar2) {
    Loader::Class::parentClassName_abi_cxx11_(&local_90,classDef);
    std::operator+(&local_70," extends ",&local_90);
  }
  else {
    std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_90);
  }
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::~string((string *)&local_50);
  poVar3 = std::operator<<(stream,"{");
  std::endl<char,std::char_traits<char>>(poVar3);
  pAVar5 = Loader::Class::attributes_abi_cxx11_(classDef);
  generateAttributes(stream,pAVar5);
  pvVar6 = Loader::Class::fields(classDef);
  pFVar1 = (pvVar6->
           super__Vector_base<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (this = (pvVar6->
              super__Vector_base<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>)
              ._M_impl.super__Vector_impl_data._M_start; this != pFVar1; this = this + 1) {
    poVar3 = std::operator<<(stream,"\t");
    psVar4 = Loader::Field::name_abi_cxx11_(this);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3," ");
    psVar4 = Loader::Field::type_abi_cxx11_(this);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    pAVar5 = Loader::Field::attributes_abi_cxx11_(this);
    generateAttributes(stream,pAVar5);
  }
  poVar3 = std::operator<<(stream,"}");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void ByteCodeGenerator::generateClass(std::ostream& stream, const Loader::Class& classDef) {
		stream << "class " << classDef.name()
			   << (classDef.parentClassName() != "" ? (" extends " + classDef.parentClassName()) : "")
			   << std::endl;
		stream << "{" << std::endl;

		generateAttributes(stream, classDef.attributes());

		for (auto& field : classDef.fields()) {
			stream << "\t" << field.name() << " " << field.type() << std::endl;
			generateAttributes(stream, field.attributes());
		}

		stream << "}" << std::endl;
	}